

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

void __thiscall cornerstone::raft_server::commit_in_bg(raft_server *this)

{
  ulong uVar1;
  ulong uVar2;
  element_type *peVar3;
  element_type *peVar4;
  long *plVar5;
  mutex_type *pmVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  buffer *pbVar8;
  char *__s;
  allocator<char> local_159;
  ptr<cluster_config> new_conf;
  ptr<log_entry> log_entry;
  string local_120 [32];
  unique_lock<std::mutex> lock;
  
LAB_00140461:
  do {
    uVar1 = this->sm_commit_index_;
    if (uVar1 < this->quick_commit_idx_) {
      iVar7 = (*((this->log_store_).
                 super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      if (uVar1 < CONCAT44(extraout_var,iVar7) - 1U) {
        while (uVar1 = this->sm_commit_index_, uVar1 < this->quick_commit_idx_) {
          iVar7 = (*((this->log_store_).
                     super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->_vptr_log_store[2])();
          if (CONCAT44(extraout_var_00,iVar7) - 1U <= uVar1) break;
          this->sm_commit_index_ = this->sm_commit_index_ + 1;
          (*((this->log_store_).
             super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_log_store[8])(&log_entry);
          if ((log_entry.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->value_type_ == conf) {
            std::recursive_mutex::lock(&this->lock_);
            pbVar8 = cornerstone::log_entry::get_buf
                               (log_entry.
                                super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
            buffer::pos(pbVar8,0);
            pbVar8 = cornerstone::log_entry::get_buf
                               (log_entry.
                                super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
            cluster_config::deserialize((cluster_config *)&new_conf,pbVar8);
            peVar4 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            __s = strfmt<100>::fmt<unsigned_long>
                            ((strfmt<100> *)&lock,
                             (new_conf.
                              super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->log_idx_);
            std::__cxx11::string::string<std::allocator<char>>(local_120,__s,&local_159);
            (*peVar4->_vptr_logger[3])(peVar4,local_120);
            std::__cxx11::string::~string(local_120);
            plVar5 = *(long **)&(((this->ctx_)._M_t.
                                  super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
                                  .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl
                                 )->state_mgr_).
                                super___shared_ptr<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2>
            ;
            (**(code **)(*plVar5 + 0x18))
                      (plVar5,new_conf.
                              super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
            this->config_changing_ = false;
            if (((this->config_).
                 super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->log_idx_ <
                (new_conf.
                 super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->log_idx_) {
              reconfigure(this,&new_conf);
            }
            if (this->catching_up_ == true) {
              cluster_config::get_server
                        ((cluster_config *)&lock,
                         (int)new_conf.
                              super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
              pmVar6 = lock._M_device;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&lock._M_owns);
              if (pmVar6 != (mutex_type *)0x0) {
                peVar4 = (this->l_).
                         super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&lock,"this server is committed as one of cluster members",
                           (allocator<char> *)local_120);
                (*peVar4->_vptr_logger[3])(peVar4,(strfmt<100> *)&lock);
                std::__cxx11::string::~string((string *)&lock);
                this->catching_up_ = false;
              }
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&new_conf.
                        super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
          }
          else if ((log_entry.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->value_type_ == app_log) {
            uVar2 = this->sm_commit_index_;
            peVar3 = (this->state_machine_).
                     super___shared_ptr<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            pbVar8 = cornerstone::log_entry::get_buf
                               (log_entry.
                                super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
            (*peVar3->_vptr_state_machine[2])
                      (peVar3,uVar2,pbVar8,
                       &(log_entry.
                         super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->cookie_);
          }
          snapshot_and_compact(this,this->sm_commit_index_);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&log_entry.
                      super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        goto LAB_00140461;
      }
    }
    plVar5 = (long *)(((this->ctx_)._M_t.
                       super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
                       .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl)->
                     event_listener_).
                     super___shared_ptr<cornerstone::raft_event_listener,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
    if (plVar5 != (long *)0x0) {
      (**(code **)(*plVar5 + 0x10))(plVar5,3);
    }
    std::unique_lock<std::mutex>::unique_lock(&lock,&this->commit_lock_);
    std::condition_variable::wait((unique_lock *)&this->commit_cv_);
    if (this->stopping_ == true) {
      std::unique_lock<std::mutex>::unlock(&lock);
      lock._M_device = (mutex_type *)0x0;
      lock._M_owns = false;
      std::mutex::lock(&this->stopping_lock_);
      std::condition_variable::notify_all();
      pthread_mutex_unlock((pthread_mutex_t *)&this->stopping_lock_);
      std::unique_lock<std::mutex>::~unique_lock(&lock);
      return;
    }
    std::unique_lock<std::mutex>::~unique_lock(&lock);
  } while( true );
}

Assistant:

void raft_server::commit_in_bg()
{
    while (true)
    {
        try
        {
            while (quick_commit_idx_ <= sm_commit_index_ || sm_commit_index_ >= log_store_->next_slot() - 1)
            {
                // already catch up all committed logs
                if (ctx_->event_listener_)
                {
                    ctx_->event_listener_->on_event(raft_event::logs_catch_up);
                }

                std::unique_lock<std::mutex> lock(commit_lock_);
                commit_cv_.wait(lock);
                if (stopping_)
                {
                    lock.unlock();
                    lock.release();
                    {
                        auto_lock(stopping_lock_);
                        ready_to_stop_cv_.notify_all();
                    }

                    return;
                }
            }

            while (sm_commit_index_ < quick_commit_idx_ && sm_commit_index_ < log_store_->next_slot() - 1)
            {
                sm_commit_index_ += 1;
                ptr<log_entry> log_entry(log_store_->entry_at(sm_commit_index_));
                if (log_entry->get_val_type() == log_val_type::app_log)
                {
                    state_machine_->commit(sm_commit_index_, log_entry->get_buf(), log_entry->get_cookie());
                }
                else if (log_entry->get_val_type() == log_val_type::conf)
                {
                    recur_lock(lock_);
                    log_entry->get_buf().pos(0);
                    ptr<cluster_config> new_conf = cluster_config::deserialize(log_entry->get_buf());
                    l_->info(sstrfmt("config at index %llu is committed").fmt(new_conf->get_log_idx()));
                    ctx_->state_mgr_->save_config(*new_conf);
                    config_changing_ = false;
                    if (config_->get_log_idx() < new_conf->get_log_idx())
                    {
                        reconfigure(new_conf);
                    }

                    if (catching_up_ && new_conf->get_server(id_) != nilptr)
                    {
                        l_->info("this server is committed as one of cluster members");
                        catching_up_ = false;
                    }
                }

                snapshot_and_compact(sm_commit_index_);
            }
        }
        catch (std::exception& err)
        {
            l_->err(lstrfmt("background committing thread encounter err %s, exiting to protect the system")
                        .fmt(err.what()));
            ctx_->state_mgr_->system_exit(-1);
        }
    }
}